

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O3

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException(MismatchedTokenException *this)

{
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Mismatched Token: expecting any AST node","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"<AST>","");
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_40,&local_60,-1,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__MismatchedTokenException_002f8eb0;
  (this->token).ref = (TokenRef *)0x0;
  (this->node).ref = (ASTRef *)0x0;
  (this->tokenText)._M_dataplus._M_p = (pointer)&(this->tokenText).field_2;
  (this->tokenText)._M_string_length = 0;
  (this->tokenText).field_2._M_local_buf[0] = '\0';
  BitSet::BitSet(&this->set,0x40);
  this->tokenNames = (char **)0x0;
  this->numTokens = 0;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException()
  : RecognitionException("Mismatched Token: expecting any AST node","<AST>",-1,-1)
  , token(0)
  , node(nullASTptr)
  , tokenNames(0)
  , numTokens(0)
{
}